

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

QRect __thiscall QTableView::visualRect(QTableView *this,QModelIndex *index)

{
  long lVar1;
  bool bVar2;
  QTableViewPrivate *this_00;
  QTableViewPrivate *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  int i;
  int colw;
  int colp;
  int rowh;
  int rowp;
  QTableViewPrivate *d;
  Span span;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  QAbstractItemViewPrivate *in_stack_ffffffffffffff70;
  byte local_81;
  byte local_75;
  QTableViewPrivate *span_00;
  QRect local_2c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QTableView *)0x8be915);
  bVar2 = QAbstractItemViewPrivate::isIndexValid
                    (in_stack_ffffffffffffff70,
                     (QModelIndex *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  local_75 = 1;
  if (bVar2) {
    QModelIndex::parent((QModelIndex *)in_stack_ffffffffffffff70);
    bVar2 = ::operator!=((QModelIndex *)
                         CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         (QPersistentModelIndex *)
                         CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    local_75 = 1;
    if (!bVar2) {
      bVar2 = QTableViewPrivate::hasSpans((QTableViewPrivate *)0x8be974);
      local_81 = 0;
      if (!bVar2) {
        local_81 = (**(code **)(*in_RDI + 0x2c0))(in_RDI,in_RSI);
      }
      local_75 = local_81;
    }
  }
  if ((local_75 & 1) == 0) {
    QAbstractItemViewPrivate::executePostedLayout
              ((QAbstractItemViewPrivate *)
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    bVar2 = QTableViewPrivate::hasSpans((QTableViewPrivate *)0x8be9cd);
    if (bVar2) {
      span_00 = this_00;
      QModelIndex::row((QModelIndex *)in_RSI);
      QModelIndex::column((QModelIndex *)in_RSI);
      QTableViewPrivate::span(this_00,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
      local_2c = QTableViewPrivate::visualSpanRect(in_RSI,(Span *)span_00);
    }
    else {
      QModelIndex::row((QModelIndex *)in_RSI);
      rowViewportPosition((QTableView *)
                          CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                          in_stack_ffffffffffffff5c);
      QModelIndex::row((QModelIndex *)in_RSI);
      rowHeight((QTableView *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                in_stack_ffffffffffffff5c);
      QModelIndex::column((QModelIndex *)in_RSI);
      columnViewportPosition
                ((QTableView *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff5c);
      QModelIndex::column((QModelIndex *)in_RSI);
      columnWidth((QTableView *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                  in_stack_ffffffffffffff5c);
      showGrid((QTableView *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                   in_stack_ffffffffffffff64,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                   in_stack_ffffffffffffff58);
    }
  }
  else {
    QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_2c;
  }
  __stack_chk_fail();
}

Assistant:

QRect QTableView::visualRect(const QModelIndex &index) const
{
    Q_D(const QTableView);
    if (!d->isIndexValid(index) || index.parent() != d->root
        || (!d->hasSpans() && isIndexHidden(index)))
        return QRect();

    d->executePostedLayout();

    if (d->hasSpans()) {
        QSpanCollection::Span span = d->span(index.row(), index.column());
        return d->visualSpanRect(span);
    }

    int rowp = rowViewportPosition(index.row());
    int rowh = rowHeight(index.row());
    int colp = columnViewportPosition(index.column());
    int colw = columnWidth(index.column());

    const int i = showGrid() ? 1 : 0;
    return QRect(colp, rowp, colw - i, rowh - i);
}